

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O2

char * stb__splitpath_raw(char *buffer,char *path,int flag)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  char *pcVar4;
  char *pcVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  char *pcVar11;
  
  sVar3 = strlen(path);
  pcVar4 = stb_strrchr2(path,'/','\\');
  uVar10 = 0xc;
  if (flag != 8) {
    uVar10 = flag;
  }
  if ((uVar10 & 7) != 0) {
    iVar7 = (int)pcVar4 + 1;
    if (pcVar4 == (char *)0x0) {
      iVar7 = 0;
    }
    iVar7 = iVar7 - (int)path;
    if (pcVar4 == (char *)0x0) {
      iVar7 = 0;
    }
    pcVar5 = strrchr(path,0x2e);
    pcVar11 = (char *)0x0;
    if (pcVar4 <= pcVar5) {
      pcVar11 = pcVar5;
    }
    if (pcVar5 == (char *)0x0) {
      pcVar11 = pcVar5;
    }
    if (pcVar4 == (char *)0x0) {
      pcVar11 = pcVar5;
    }
    iVar6 = (int)pcVar11 - (int)path;
    if (pcVar11 == (char *)0x0) {
      iVar6 = (int)sVar3;
    }
    if ((uVar10 & 1) == 0) {
      bVar1 = true;
      iVar2 = 0;
      iVar9 = iVar7;
      iVar8 = iVar6;
      if (((uVar10 & 2) == 0) && (iVar2 = 0, iVar9 = iVar6, iVar8 = iVar7, (uVar10 & 8) != 0)) {
        iVar2 = 0;
        iVar9 = (uint)(buffer[iVar6] == '.') + iVar6;
      }
    }
    else {
      bVar1 = uVar10 != 1 || iVar7 != 0;
      iVar8 = iVar7;
      if ((uVar10 & 2) != 0) {
        iVar8 = iVar6;
      }
      iVar2 = (uint)(uVar10 == 1 && iVar7 == 0) * 2;
      iVar9 = 0;
    }
    if ((uVar10 & 4) != 0) {
      iVar8 = (int)sVar3;
    }
    if ((buffer != (char *)0x0) ||
       (buffer = (char *)malloc((long)(((iVar2 + iVar8) - iVar9) + 1)), buffer != (char *)0x0)) {
      if (bVar1) {
        strncpy(buffer,path + iVar9,(long)(iVar8 - iVar9));
        buffer[iVar8 - iVar9] = '\0';
        return buffer;
      }
      buffer[2] = '\0';
      buffer[0] = '.';
      buffer[1] = '/';
      return buffer;
    }
  }
  return (char *)0x0;
}

Assistant:

static char *stb__splitpath_raw(char *buffer, char *path, int flag)
{
   int len=0,x,y, n = (int) strlen(path), f1,f2;
   char *s = stb_strrchr2(path, '/', '\\');
   char *t = strrchr(path, '.');
   if (s && t && t < s) t = NULL;
   if (s) ++s;

   if (flag == STB_EXT_NO_PERIOD)
      flag |= STB_EXT;

   if (!(flag & (STB_PATH | STB_FILE | STB_EXT))) return NULL;

   f1 = s == NULL ? 0 : s-path; // start of filename
   f2 = t == NULL ? n : t-path; // just past end of filename

   if (flag & STB_PATH) {
      x = 0; if (f1 == 0 && flag == STB_PATH) len=2;
   } else if (flag & STB_FILE) {
      x = f1;
   } else {
      x = f2;
      if (flag & STB_EXT_NO_PERIOD)
         if (buffer[x] == '.')
            ++x;
   }

   if (flag & STB_EXT)
      y = n;
   else if (flag & STB_FILE)
      y = f2;
   else
      y = f1;

   if (buffer == NULL) {
      buffer = (char *) malloc(y-x + len + 1);
      if (!buffer) return NULL;
   }

   if (len) { strcpy(buffer, "./"); return buffer; }
   strncpy(buffer, path+x, y-x);
   buffer[y-x] = 0;
   return buffer;
}